

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbvthandler_p.cpp
# Opt level: O0

void QFbVtHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  QFbVtHandler *_t;
  QFbVtHandler *in_stack_ffffffffffffffb0;
  
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      interrupted((QFbVtHandler *)0x134738);
      break;
    case 1:
      aboutToSuspend((QFbVtHandler *)0x134744);
      break;
    case 2:
      resumed((QFbVtHandler *)0x134750);
      break;
    case 3:
      handleSignal(in_stack_ffffffffffffffb0);
    }
  }
  if (((in_ESI == 5) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QFbVtHandler::*)()>(in_RCX,(void **)interrupted,0,0)
      , !bVar1)) &&
     (bVar1 = QtMocHelpers::indexOfMethod<void(QFbVtHandler::*)()>
                        (in_RCX,(void **)aboutToSuspend,0,1), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QFbVtHandler::*)()>(in_RCX,(void **)resumed,0,2);
  }
  return;
}

Assistant:

void QFbVtHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFbVtHandler *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->interrupted(); break;
        case 1: _t->aboutToSuspend(); break;
        case 2: _t->resumed(); break;
        case 3: _t->handleSignal(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::interrupted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::aboutToSuspend, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::resumed, 2))
            return;
    }
}